

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadCustomSection(WasmBinaryReader *this)

{
  uint32 uVar1;
  char16 *pcVar2;
  byte *pbVar3;
  CustomSection customSection_00;
  bool bVar4;
  size_t value;
  size_t size;
  CustomSection customSection;
  WasmBinaryReader *this_local;
  
  pcVar2 = (this->m_currentSection).name;
  uVar1 = (this->m_currentSection).nameLength;
  pbVar3 = this->m_pc;
  value = (long)(this->m_currentSection).end - (long)this->m_pc;
  if (this->m_pc <= (this->m_currentSection).end) {
    bVar4 = Math::FitsInDWord(value);
    if (bVar4) {
      customSection_00._12_4_ = customSection.name._4_4_;
      customSection_00.nameLength = uVar1;
      customSection_00._28_4_ = customSection.payload._4_4_;
      customSection_00.payloadSize = (int)value;
      customSection_00.name = pcVar2;
      customSection_00.payload = pbVar3;
      Js::WebAssemblyModule::AddCustomSection(this->m_module,customSection_00);
      this->m_pc = (this->m_currentSection).end;
      return;
    }
  }
  ThrowDecodingError(this,L"Invalid custom section size");
}

Assistant:

void WasmBinaryReader::ReadCustomSection()
{
    CustomSection customSection;
    customSection.name = m_currentSection.name;
    customSection.nameLength = m_currentSection.nameLength;
    customSection.payload = m_pc;

    size_t size = m_currentSection.end - m_pc;
    if (m_currentSection.end < m_pc || !Math::FitsInDWord(size))
    {
        ThrowDecodingError(_u("Invalid custom section size"));
    }
    customSection.payloadSize = (uint32)size;
    m_module->AddCustomSection(customSection);
    m_pc = m_currentSection.end;
}